

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O1

void __thiscall
BarrierTest_ArriveAndDropCompletion_Test::TestBody(BarrierTest_ArriveAndDropCompletion_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  char *message;
  int counter;
  TrueWithString gtest_msg;
  barrier<counting_completion> barrier;
  AssertHelper local_f0 [2];
  int local_dc;
  undefined8 *local_d8;
  undefined8 *puStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Message local_b8 [4];
  barrier<counting_completion> local_98;
  
  local_98.completion_.counter = &local_dc;
  local_dc = 0;
  local_98.init_count_ = 1;
  local_98.counter_ = 1;
  local_98.phase_ = 0;
  std::condition_variable::condition_variable(&local_98.cv_);
  local_98.mtx_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_98.mtx_.super___mutex_base._M_mutex._16_8_ = 0;
  local_98.mtx_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_98.mtx_.super___mutex_base._M_mutex.__align = 0;
  local_98.mtx_.super___mutex_base._M_mutex._8_8_ = 0;
  uStack_c0 = 0;
  puStack_d0 = (undefined8 *)0x0;
  local_c8 = 0;
  local_d8 = &local_c8;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    yamc::barrier<counting_completion>::arrive_and_drop(&local_98);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  local_b8[0].ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_d8,"counter","1",&local_dc,(int *)local_b8);
  if (local_d8._0_1_ == (internal)0x0) {
    testing::Message::Message(local_b8);
    if (puStack_d0 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*puStack_d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/barrier_test.cpp"
               ,0x84,message);
    testing::internal::AssertHelper::operator=(local_f0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if ((long *)CONCAT44(local_b8[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_b8[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_b8[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_b8[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  puVar1 = puStack_d0;
  if (puStack_d0 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_d0 != puStack_d0 + 2) {
      operator_delete((undefined8 *)*puStack_d0);
    }
    operator_delete(puVar1);
  }
  std::condition_variable::~condition_variable(&local_98.cv_);
  return;
}

Assistant:

TEST(BarrierTest, ArriveAndDropCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{1, complation};
  EXPECT_NO_THROW(barrier.arrive_and_drop());
  EXPECT_EQ(counter, 1);
}